

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O3

ScalarFunction * duckdb::ListValueFun::GetFunction(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ScalarFunction *in_RDI;
  code *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a8;
  LogicalType local_90 [24];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  LogicalType local_58 [24];
  LogicalType local_40;
  undefined1 local_3f;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"list_value","");
  local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::LogicalType(local_90,LIST);
  local_c0 = 0;
  local_c8 = ListValueFunction;
  local_b0 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_58,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_58);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  duckdb::LogicalType::~LogicalType(local_90);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a8);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  duckdb::LogicalType::LogicalType(&local_40,ANY);
  in_RDI->field_0x78 = local_40;
  in_RDI->field_0x79 = local_3f;
  uVar1 = *(undefined8 *)&in_RDI->field_0x80;
  uVar2 = *(undefined8 *)&in_RDI->field_0x88;
  *(undefined8 *)&in_RDI->field_0x80 = local_38;
  *(undefined8 *)&in_RDI->field_0x88 = uStack_30;
  local_38 = uVar1;
  uStack_30 = uVar2;
  duckdb::LogicalType::~LogicalType(&local_40);
  in_RDI->field_0xa9 = 1;
  return in_RDI;
}

Assistant:

ScalarFunction ListValueFun::GetFunction() {
	// the arguments and return types are actually set in the binder function
	ScalarFunction fun("list_value", {}, LogicalTypeId::LIST, ListValueFunction, ListValueBind, nullptr,
	                   ListValueStats);
	fun.varargs = LogicalType::ANY;
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}